

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O1

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::~ParserTemplate(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                  *this)

{
  (this->super_ParserTemplateBase).super_Parser._vptr_Parser =
       (_func_int **)&PTR__ParserTemplate_009296a8;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mElementToNamespaceMap)._M_t);
  std::
  deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
  ::~deque(&(this->mNamespacesStack).c);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
  ::~_Rb_tree(&(this->mNamespaceHandlers)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  ::~_Rb_tree(&(this->mElementFunctionMap)._M_t);
  ParserTemplateBase::~ParserTemplateBase(&this->super_ParserTemplateBase);
  return;
}

Assistant:

void setCallbackObject(ImplClass* impl){ mImpl = impl; }